

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentType *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EnvironmentType *local_18;
  EnvironmentType *this_local;
  
  local_18 = this;
  this_local = (EnvironmentType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(ushort)this->m_ui8EntityKind);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Domain);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Class);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Category);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SubCategory);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Specific);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Extra);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentType::GetAsString() const
{
    KStringStream ss;

    ss << ( KUINT16 )m_ui8EntityKind  << " , "
       << ( KUINT16 )m_ui8Domain      << " , "
       << ( KUINT16 )m_ui16Class      << " , "
       << ( KUINT16 )m_ui8Category    << " , "
       << ( KUINT16 )m_ui8SubCategory << " , "
       << ( KUINT16 )m_ui8Specific    << " , "
       << ( KUINT16 )m_ui8Extra
       << "\n";

    return ss.str();
}